

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.h
# Opt level: O0

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::shiftLCbound(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,int i,
              number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *to)

{
  type_conflict5 tVar1;
  cpp_dec_float<50U,_int,_void> *in_RDX;
  cpp_dec_float<50U,_int,_void> *in_RDI;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  cpp_dec_float<50U,_int,_void> *this_00;
  self_type *in_stack_fffffffffffffec8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffed0;
  undefined1 local_100 [80];
  undefined8 local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_90;
  undefined1 *local_88;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_79;
  cpp_dec_float<50U,_int,_void> *local_78;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  cpp_dec_float<50U,_int,_void> *local_58;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_50;
  undefined1 *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  cpp_dec_float<50U,_int,_void> *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  cpp_dec_float<50U,_int,_void> *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  
  local_30 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)in_RDX,(int)((ulong)in_RDI >> 0x20));
  local_28 = &stack0xfffffffffffffec8;
  local_38 = in_RDX;
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_39,local_30,
             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)in_RDX);
  local_20 = &stack0xfffffffffffffec8;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(in_RDX);
  local_8 = &stack0xfffffffffffffec8;
  local_10 = local_30;
  local_18 = local_38;
  boost::multiprecision::default_ops::
  eval_subtract<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (in_RDX,in_RDI,(cpp_dec_float<50U,_int,_void> *)0x376e55);
  this_00 = (cpp_dec_float<50U,_int,_void> *)0x0;
  tVar1 = boost::multiprecision::operator>
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)in_RDI,(double *)0x376e6d);
  if (tVar1) {
    local_70 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)in_RDX,(int)((ulong)in_RDI >> 0x20));
    local_68 = local_100;
    local_78 = in_RDX;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_79,local_70,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)in_RDX);
    local_60 = local_100;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(in_RDX);
    local_48 = local_100;
    local_50 = local_70;
    local_58 = local_78;
    boost::multiprecision::default_ops::
    eval_subtract<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (in_RDX,in_RDI,(cpp_dec_float<50U,_int,_void> *)0x376f33);
  }
  else {
    local_a0 = local_100;
    local_a8 = &stack0xfffffffffffffeb8;
    local_b0 = 0;
    local_88 = local_a8;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (this_00,0.0,in_RDX);
  }
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  ::operator+=(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  local_90 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)in_RDX,(int)((ulong)in_RDI >> 0x20));
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(in_RDX,in_RDI);
  return;
}

Assistant:

void shiftLCbound(int i, R to)
   {
      assert(theType == LEAVE);
      // use maximum to not count tightened bounds in case of equality shifts
      theShift += SOPLEX_MAX((*theCoLbound)[i] - to, 0.0);
      (*theCoLbound)[i] = to;
   }